

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dspsubrs.c
# Opt level: O1

void DSP_SetMousePos(LispPTR *args)

{
  uint uVar1;
  uint uVar2;
  
  if (Mouse_Included != 0) {
    uVar1 = *args;
    if ((uVar1 & 0xfff0000) == 0xf0000) {
      uVar1 = uVar1 | 0xffff0000;
    }
    else if ((uVar1 & 0xfff0000) == 0xe0000) {
      uVar1 = uVar1 & 0xffff;
    }
    else {
      error("Not smallp address");
      uVar1 = 0;
    }
    uVar2 = args[1];
    if ((uVar2 & 0xfff0000) == 0xf0000) {
      uVar2 = uVar2 | 0xffff0000;
    }
    else if ((uVar2 & 0xfff0000) == 0xe0000) {
      uVar2 = uVar2 & 0xffff;
    }
    else {
      error("Not smallp address");
      uVar2 = 0;
    }
    set_Xmouseposition(uVar1,uVar2);
    return;
  }
  return;
}

Assistant:

void DSP_SetMousePos(LispPTR *args)
{

#ifdef XWINDOW
  if (Mouse_Included)
    set_Xmouseposition((int)(GetSmalldata(args[0])), (int)(GetSmalldata(args[1])));
#endif /* XWINDOW */
#ifdef SDL
  int x = (int)(GetSmalldata(args[0]));
  int y = (int)(GetSmalldata(args[1]));
  sdl_setMousePosition(x, y);
#endif /* SDL */
}